

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  uint uVar1;
  upb_tabent *puVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uintptr_t val_1;
  
  uVar5 = *iter;
  uVar6 = (ulong)((t->t).mask + 1);
  lVar4 = uVar5 * 0x18 + 0x20;
  do {
    lVar7 = lVar4;
    uVar5 = uVar5 + 1;
    if (uVar6 <= uVar5) goto LAB_004e68a9;
    puVar2 = (t->t).entries;
    puVar3 = *(uint **)((long)&(puVar2->val).val + lVar7);
    lVar4 = lVar7 + 0x18;
  } while (puVar3 == (uint *)0x0);
  uVar1 = *puVar3;
  key->data = (char *)(puVar3 + 1);
  key->size = (ulong)uVar1;
  val->val = *(uint64_t *)((long)&puVar2[-1].next + lVar7);
  *iter = uVar5;
LAB_004e68a9:
  return uVar5 < uVar6;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = upb_key_strview(ent->key);
    *val = ent->val;
    *iter = tab_idx;
    return true;
  }

  return false;
}